

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O1

void __thiscall jsonChildren::doerase(jsonChildren *this,JSONNode **position,json_index_t number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  JSONNode **ppJVar3;
  JSONNode **ppJVar4;
  ulong uVar5;
  json_string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Children is null doerase","")
  ;
  JSONDebug::_JSON_ASSERT(true,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ppJVar3 = this->array;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"erasing something from a null array 2","");
  JSONDebug::_JSON_ASSERT(ppJVar3 != (JSONNode **)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ppJVar3 = this->array;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"position is beneath the start of the array 2","");
  JSONDebug::_JSON_ASSERT(ppJVar3 <= position,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ppJVar4 = this->array;
  uVar2 = this->mysize;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"erasing out of bounds 2","");
  ppJVar3 = position + number;
  JSONDebug::_JSON_ASSERT(ppJVar3 <= ppJVar4 + uVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar5 = (ulong)((long)position - (long)this->array) >> 3;
  if (ppJVar3 < this->array + this->mysize) {
    memmove(position,ppJVar3,((ulong)this->mysize - (uVar5 + number)) * 8);
    uVar5 = (ulong)(this->mysize - number);
  }
  this->mysize = (json_index_t)uVar5;
  return;
}

Assistant:

void jsonChildren::doerase(JSONNode ** position, json_index_t number) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null doerase"));
    JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 2"));
    JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 2"));
    JSON_ASSERT(position + number <= array + mysize, JSON_TEXT("erasing out of bounds 2"));
    if (position + number >= array + mysize){
	   mysize = (json_index_t)(position - array);
	   #ifndef JSON_ISO_STRICT
		  JSON_ASSERT((long long)position - (long long)array >= 0, JSON_TEXT("doing negative allocation"));
	   #endif
    } else {
	   std::memmove(position, position + number, (mysize - (position - array) - number) * sizeof(JSONNode *));
	   mysize -= number;
    }
}